

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O3

void __thiscall VariationalBayesEstimatorOnLDA::calculateEx(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar8 = (ulong)this->_K;
  uVar1 = this->_D;
  if ((ulong)uVar1 != 0) {
    pvVar2 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (this->_thetaEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if (uVar8 != 0) {
        lVar6 = *(long *)&pvVar2[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = *(long *)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar10 = 0;
        do {
          *(double *)(lVar7 + uVar10 * 8) =
               (*(double *)(lVar6 + uVar10 * 8) + pdVar4[uVar10]) /
               (pdVar5[uVar9] + this->_alphaSum);
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  if (uVar8 != 0) {
    uVar1 = this->_V;
    pvVar2 = (this->_nkv).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar3 = (this->_phiEx).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        lVar6 = *(long *)&pvVar2[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar7 = *(long *)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar10 = 0;
        do {
          *(double *)(lVar7 + uVar10 * 8) =
               (*(double *)(lVar6 + uVar10 * 8) + pdVar4[uVar10]) / (pdVar5[uVar9] + this->_betaSum)
          ;
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::calculateEx(){//{{{
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _thetaEx[d][k]=(_ndk[d][k]+_alpha[k])/(_nd[d]+_alphaSum);
        }
    }
    for(int k=0;k<_K;k++){
        for(int v=0;v<_V;v++){
            _phiEx[k][v]=(_nkv[k][v]+_beta[v])/(_nk[k]+_betaSum);
        }
    }

}